

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatterTest_NoArgs_Test::TestBody(FormatterTest_NoArgs_Test *this)

{
  bool bVar1;
  char *message;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  AssertionResult gtest_ar;
  internal local_278 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined4 local_248 [4];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  undefined1 *local_230;
  long lStack_228;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  local_248[0] = 0;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str.size_ = 4;
  format_str.data_ = "test";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_248;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str,args,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_278,"\"test\"","format(\"test\")",(char (*) [5])0x250ec9,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x2f7,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, NoArgs) {
  EXPECT_EQ("test", format("test"));
}